

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8_regexp.cc
# Opt level: O0

RegExp * re2c::UTF8Symbol(rune r)

{
  uint32_t uVar1;
  Range *pRVar2;
  CatOp *this;
  MatchOp *this_00;
  uint local_48;
  uint32_t i;
  CatOp *local_38;
  RegExp *re;
  uint32_t local_28;
  uint32_t chars_count;
  uint32_t chars [4];
  rune r_local;
  
  uVar1 = utf8::rune_to_bytes(&local_28,r);
  local_38 = (CatOp *)operator_new(0x10);
  pRVar2 = Range::sym(local_28);
  MatchOp::MatchOp((MatchOp *)local_38,pRVar2);
  for (local_48 = 1; local_48 < uVar1; local_48 = local_48 + 1) {
    this = (CatOp *)operator_new(0x18);
    this_00 = (MatchOp *)operator_new(0x10);
    pRVar2 = Range::sym((&local_28)[local_48]);
    MatchOp::MatchOp(this_00,pRVar2);
    CatOp::CatOp(this,&local_38->super_RegExp,(RegExp *)this_00);
    local_38 = this;
  }
  return &local_38->super_RegExp;
}

Assistant:

RegExp * UTF8Symbol(utf8::rune r)
{
	uint32_t chars[utf8::MAX_RUNE_LENGTH];
	const uint32_t chars_count = utf8::rune_to_bytes(chars, r);
	RegExp * re = new MatchOp(Range::sym (chars[0]));
	for (uint32_t i = 1; i < chars_count; ++i)
		re = new CatOp(re, new MatchOp(Range::sym (chars[i])));
	return re;
}